

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3NestedParse(Parse *pParse,char *zFormat,...)

{
  undefined4 uVar1;
  long lVar2;
  char in_AL;
  char *pcVar3;
  char *in_RCX;
  __va_list_tag *in_RDX;
  long *in_RDI;
  sqlite3 *in_R8;
  long in_FS_OFFSET;
  char *in_XMM1_Qa;
  Parse *in_XMM1_Qb;
  u32 savedDbFlags;
  sqlite3 *db;
  char *zSql;
  char saveBuf [136];
  va_list ap;
  void *in_stack_fffffffffffffe68;
  sqlite3 *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffea8;
  Parse *in_stack_fffffffffffffeb0;
  undefined1 local_b8 [144];
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  long local_8;
  
  if (in_AL != '\0') {
    in_stack_fffffffffffffea8 = in_XMM1_Qa;
    in_stack_fffffffffffffeb0 = in_XMM1_Qb;
  }
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  lVar2 = *in_RDI;
  uVar1 = *(undefined4 *)(lVar2 + 0x2c);
  memset(local_b8,0xaa,0x88);
  if ((*(int *)((long)in_RDI + 0x34) == 0) && (*(char *)((long)in_RDI + 0x134) == '\0')) {
    local_20 = &stack0x00000008;
    local_28 = (undefined1 *)0x3000000010;
    local_18 = &stack0xfffffffffffffe68;
    pcVar3 = sqlite3VMPrintf(in_R8,in_RCX,in_RDX);
    if (pcVar3 == (char *)0x0) {
      if (*(char *)(lVar2 + 0x67) == '\0') {
        *(undefined4 *)(in_RDI + 3) = 0x12;
      }
      *(int *)((long)in_RDI + 0x34) = *(int *)((long)in_RDI + 0x34) + 1;
    }
    else {
      *(char *)((long)in_RDI + 0x1e) = *(char *)((long)in_RDI + 0x1e) + '\x01';
      memcpy(local_b8,in_RDI + 0x24,0x88);
      memset(in_RDI + 0x24,0,0x88);
      *(uint *)(lVar2 + 0x2c) = *(uint *)(lVar2 + 0x2c) | 2;
      sqlite3RunParser(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      *(undefined4 *)(lVar2 + 0x2c) = uVar1;
      sqlite3DbFree(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
      memcpy(in_RDI + 0x24,local_b8,0x88);
      *(char *)((long)in_RDI + 0x1e) = *(char *)((long)in_RDI + 0x1e) + -1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3NestedParse(Parse *pParse, const char *zFormat, ...){
  va_list ap;
  char *zSql;
  sqlite3 *db = pParse->db;
  u32 savedDbFlags = db->mDbFlags;
  char saveBuf[PARSE_TAIL_SZ];

  if( pParse->nErr ) return;
  if( pParse->eParseMode ) return;
  assert( pParse->nested<10 );  /* Nesting should only be of limited depth */
  va_start(ap, zFormat);
  zSql = sqlite3VMPrintf(db, zFormat, ap);
  va_end(ap);
  if( zSql==0 ){
    /* This can result either from an OOM or because the formatted string
    ** exceeds SQLITE_LIMIT_LENGTH.  In the latter case, we need to set
    ** an error */
    if( !db->mallocFailed ) pParse->rc = SQLITE_TOOBIG;
    pParse->nErr++;
    return;
  }
  pParse->nested++;
  memcpy(saveBuf, PARSE_TAIL(pParse), PARSE_TAIL_SZ);
  memset(PARSE_TAIL(pParse), 0, PARSE_TAIL_SZ);
  db->mDbFlags |= DBFLAG_PreferBuiltin;
  sqlite3RunParser(pParse, zSql);
  db->mDbFlags = savedDbFlags;
  sqlite3DbFree(db, zSql);
  memcpy(PARSE_TAIL(pParse), saveBuf, PARSE_TAIL_SZ);
  pParse->nested--;
}